

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::ServiceOptions::ServiceOptions(ServiceOptions *this)

{
  undefined8 *in_RDI;
  ExtensionSet *in_stack_00000020;
  Arena *in_stack_ffffffffffffffb8;
  Message *in_stack_ffffffffffffffc0;
  ServiceOptions *this_00;
  
  Message::Message(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__ServiceOptions_008db0f0;
  internal::ExtensionSet::ExtensionSet(in_stack_00000020);
  this_00 = (ServiceOptions *)(in_RDI + 4);
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)this_00,in_stack_ffffffffffffffb8);
  memset(in_RDI + 5,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x510687);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)0x510699);
  SharedCtor(this_00);
  return;
}

Assistant:

ServiceOptions::ServiceOptions()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.ServiceOptions)
}